

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_go.cpp
# Opt level: O0

void __thiscall
flatbuffers::go::GoGenerator::BeginEnumNames(GoGenerator *this,EnumDef *enum_def,string *code_ptr)

{
  string local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  string *local_28;
  string *code;
  string *code_ptr_local;
  EnumDef *enum_def_local;
  GoGenerator *this_local;
  
  local_28 = code_ptr;
  code = code_ptr;
  code_ptr_local = (string *)enum_def;
  enum_def_local = (EnumDef *)this;
  std::__cxx11::string::operator+=((string *)code_ptr,"var EnumNames");
  std::__cxx11::string::operator+=((string *)local_28,(string *)code_ptr_local);
  GetEnumTypeName_abi_cxx11_(&local_88,this,(EnumDef *)code_ptr_local);
  std::operator+(&local_68," = map[",&local_88);
  std::operator+(&local_48,&local_68,"]string{\n");
  std::__cxx11::string::operator+=((string *)local_28,(string *)&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_88);
  return;
}

Assistant:

void BeginEnumNames(const EnumDef &enum_def, std::string *code_ptr) {
    std::string &code = *code_ptr;
    code += "var EnumNames";
    code += enum_def.name;
    code += " = map[" + GetEnumTypeName(enum_def) + "]string{\n";
  }